

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O3

int secp256k1_fe_equal(secp256k1_fe *a,secp256k1_fe *b)

{
  int iVar1;
  int extraout_EAX;
  long *in_RCX;
  size_t sVar2;
  ulong uVar3;
  secp256k1_musig_keyagg_cache *cache;
  uint64_t uVar4;
  uchar *buf;
  ulong uVar5;
  long lVar6;
  secp256k1_keyagg_cache_internal *psVar7;
  secp256k1_ge *psVar8;
  secp256k1_context *ctx;
  ulong uVar9;
  ulong uVar10;
  secp256k1_ge *psVar11;
  size_t in_R8;
  uint64_t uVar12;
  uint64_t uVar13;
  ulong uVar14;
  uint64_t uVar15;
  byte bVar16;
  secp256k1_fe na;
  secp256k1_ge sStack_360;
  secp256k1_context *psStack_2f8;
  uchar auStack_2f0 [8];
  uchar auStack_2e8 [8];
  uchar auStack_2e0 [8];
  uchar auStack_2d8 [16];
  secp256k1_ge sStack_2c8;
  secp256k1_keyagg_cache_internal sStack_260;
  secp256k1_gej sStack_140;
  secp256k1_fe *psStack_a8;
  uint64_t uStack_a0;
  uint64_t uStack_98;
  secp256k1_fe *psStack_90;
  secp256k1_fe *psStack_88;
  code *pcStack_80;
  uint64_t local_70;
  uint64_t local_68;
  secp256k1_fe local_60;
  
  bVar16 = 0;
  pcStack_80 = (code *)0x125041;
  secp256k1_fe_verify(a);
  pcStack_80 = (code *)0x125049;
  secp256k1_fe_verify(b);
  pcStack_80 = (code *)0x125056;
  secp256k1_fe_verify_magnitude(a,1);
  pcStack_80 = (code *)0x125063;
  secp256k1_fe_verify_magnitude(b,0x1f);
  pcStack_80 = (code *)0x12506b;
  secp256k1_fe_verify(a);
  buf = (uchar *)0x1;
  pcStack_80 = (code *)0x125078;
  secp256k1_fe_verify_magnitude(a,1);
  local_68 = 0x3ffffbfffff0bc - a->n[0];
  uVar12 = 0x3ffffffffffffc - a->n[1];
  uVar4 = 0x3ffffffffffffc - a->n[2];
  local_70 = 0x3ffffffffffffc - a->n[3];
  uVar13 = 0x3fffffffffffc - a->n[4];
  local_60.magnitude = 2;
  local_60.normalized = 0;
  pcStack_80 = (code *)0x1250e1;
  local_60.n[0] = local_68;
  local_60.n[1] = uVar12;
  local_60.n[2] = uVar4;
  local_60.n[3] = local_70;
  local_60.n[4] = uVar13;
  secp256k1_fe_verify(&local_60);
  pcStack_80 = (code *)0x1250e9;
  secp256k1_fe_verify(&local_60);
  pcStack_80 = (code *)0x1250f1;
  ctx = (secp256k1_context *)b;
  secp256k1_fe_verify(b);
  if (b->magnitude < 0x1f) {
    uVar15 = local_68 + b->n[0];
    uVar12 = uVar12 + b->n[1];
    uVar4 = uVar4 + b->n[2];
    local_70 = local_70 + b->n[3];
    uVar14 = uVar13 + b->n[4];
    local_60.normalized = 0;
    local_60.magnitude = b->magnitude + 2;
    pcStack_80 = (code *)0x12514e;
    local_60.n[0] = uVar15;
    local_60.n[1] = uVar12;
    local_60.n[2] = uVar4;
    local_60.n[3] = local_70;
    local_60.n[4] = uVar14;
    secp256k1_fe_verify(&local_60);
    pcStack_80 = (code *)0x125156;
    secp256k1_fe_verify(&local_60);
    uVar5 = (uVar14 >> 0x30) * 0x1000003d1 + uVar15;
    uVar3 = (uVar5 >> 0x34) + uVar12;
    uVar9 = (uVar3 >> 0x34) + uVar4;
    uVar10 = (uVar9 >> 0x34) + local_70;
    uVar14 = (uVar10 >> 0x34) + (uVar14 & 0xffffffffffff);
    return (int)(((uVar5 ^ 0x1000003d0) & uVar3 & uVar9 & uVar10 & (uVar14 ^ 0xf000000000000)) ==
                 0xfffffffffffff ||
                ((uVar3 | uVar5 | uVar9 | uVar10) & 0xfffffffffffff) == 0 && uVar14 == 0);
  }
  pcStack_80 = secp256k1_musig_pubkey_agg;
  secp256k1_fe_equal_cold_1();
  psStack_a8 = b;
  uStack_a0 = uVar12;
  uStack_98 = uVar13;
  psStack_90 = a;
  psStack_88 = &local_60;
  pcStack_80 = (code *)uVar4;
  if (ctx != (secp256k1_context *)0x0) {
    if (buf != (uchar *)0x0) {
      buf[0x30] = '\0';
      buf[0x31] = '\0';
      buf[0x32] = '\0';
      buf[0x33] = '\0';
      buf[0x34] = '\0';
      buf[0x35] = '\0';
      buf[0x36] = '\0';
      buf[0x37] = '\0';
      buf[0x38] = '\0';
      buf[0x39] = '\0';
      buf[0x3a] = '\0';
      buf[0x3b] = '\0';
      buf[0x3c] = '\0';
      buf[0x3d] = '\0';
      buf[0x3e] = '\0';
      buf[0x3f] = '\0';
      buf[0x20] = '\0';
      buf[0x21] = '\0';
      buf[0x22] = '\0';
      buf[0x23] = '\0';
      buf[0x24] = '\0';
      buf[0x25] = '\0';
      buf[0x26] = '\0';
      buf[0x27] = '\0';
      buf[0x28] = '\0';
      buf[0x29] = '\0';
      buf[0x2a] = '\0';
      buf[0x2b] = '\0';
      buf[0x2c] = '\0';
      buf[0x2d] = '\0';
      buf[0x2e] = '\0';
      buf[0x2f] = '\0';
      buf[0x10] = '\0';
      buf[0x11] = '\0';
      buf[0x12] = '\0';
      buf[0x13] = '\0';
      buf[0x14] = '\0';
      buf[0x15] = '\0';
      buf[0x16] = '\0';
      buf[0x17] = '\0';
      buf[0x18] = '\0';
      buf[0x19] = '\0';
      buf[0x1a] = '\0';
      buf[0x1b] = '\0';
      buf[0x1c] = '\0';
      buf[0x1d] = '\0';
      buf[0x1e] = '\0';
      buf[0x1f] = '\0';
      buf[0] = '\0';
      buf[1] = '\0';
      buf[2] = '\0';
      buf[3] = '\0';
      buf[4] = '\0';
      buf[5] = '\0';
      buf[6] = '\0';
      buf[7] = '\0';
      buf[8] = '\0';
      buf[9] = '\0';
      buf[10] = '\0';
      buf[0xb] = '\0';
      buf[0xc] = '\0';
      buf[0xd] = '\0';
      buf[0xe] = '\0';
      buf[0xf] = '\0';
    }
    if (in_RCX == (long *)0x0) goto LAB_0012548a;
    if (in_R8 == 0) {
      secp256k1_musig_pubkey_agg_cold_3();
      return 0;
    }
    psStack_2f8 = ctx;
    secp256k1_ge_set_infinity(&sStack_2c8);
    if (in_R8 != 1) {
      sVar2 = 1;
LAB_00125277:
      lVar6 = 0;
LAB_0012527e:
      if (*(uchar *)(*in_RCX + lVar6) == ((secp256k1_pubkey *)in_RCX[sVar2])->data[lVar6])
      goto code_r0x00125288;
      iVar1 = secp256k1_pubkey_load(ctx,&sStack_260.pk,(secp256k1_pubkey *)in_RCX[sVar2]);
      if (iVar1 == 0) {
        return 0;
      }
      psVar7 = &sStack_260;
      psVar8 = &sStack_2c8;
      for (lVar6 = 0xd; lVar6 != 0; lVar6 = lVar6 + -1) {
        (psVar8->x).n[0] = (psVar7->pk).x.n[0];
        psVar7 = (secp256k1_keyagg_cache_internal *)((long)psVar7 + ((ulong)bVar16 * -2 + 1) * 8);
        psVar8 = (secp256k1_ge *)((long)psVar8 + (ulong)bVar16 * -0x10 + 8);
      }
    }
LAB_001252c8:
    sStack_260.pk.x.n[0] = 0xc8fff302b399d5e0;
    sStack_260.pk.x.n[1] = 0x7c5b7f16badac71;
    sStack_260.pk.x.n[2] = 0x2a72ecf89701e2ef;
    sStack_260.pk.x.n[3] = 0xab148a38201a4c7b;
    sStack_260.pk.infinity = 0x40;
    sStack_260.pk._100_4_ = 0;
    sVar2 = 0;
    while( true ) {
      sStack_360.x.n[0] = 0x21;
      iVar1 = secp256k1_ec_pubkey_serialize
                        (ctx,(uchar *)&sStack_140,(size_t *)&sStack_360,
                         (secp256k1_pubkey *)in_RCX[sVar2],0x102);
      if (iVar1 == 0) {
        return 0;
      }
      if (sStack_360.x.n[0] != 0x21) break;
      secp256k1_sha256_write((secp256k1_sha256 *)&sStack_260,(uchar *)&sStack_140,0x21);
      sVar2 = sVar2 + 1;
      if (in_R8 == sVar2) {
        secp256k1_sha256_finalize((secp256k1_sha256 *)&sStack_260,auStack_2f0);
        iVar1 = secp256k1_ecmult_multi_var
                          (&ctx->error_callback,(secp256k1_scratch *)0x0,&sStack_140,
                           (secp256k1_scalar *)0x0,secp256k1_musig_pubkey_agg_callback,&psStack_2f8,
                           in_R8);
        if (iVar1 == 0) {
          return 0;
        }
        psVar8 = &sStack_360;
        secp256k1_ge_set_gej(psVar8,&sStack_140);
        secp256k1_fe_normalize_var(&sStack_360.y);
        secp256k1_ge_verify(psVar8);
        if (sStack_360.infinity != 0) {
          secp256k1_musig_pubkey_agg_cold_2();
          psVar8->infinity = 1;
          (psVar8->x).n[0] = 0;
          (psVar8->x).n[1] = 0;
          (psVar8->x).n[2] = 0;
          (psVar8->x).n[3] = 0;
          *(undefined8 *)((long)(psVar8->x).n + 0x1c) = 0;
          *(undefined8 *)((long)(psVar8->x).n + 0x24) = 0;
          (psVar8->x).normalized = 1;
          secp256k1_fe_verify(&psVar8->x);
          *(undefined8 *)((long)(psVar8->y).n + 0x1c) = 0;
          *(undefined8 *)((long)(psVar8->y).n + 0x24) = 0;
          (psVar8->y).n[2] = 0;
          (psVar8->y).n[3] = 0;
          (psVar8->y).n[0] = 0;
          (psVar8->y).n[1] = 0;
          (psVar8->y).normalized = 1;
          secp256k1_fe_verify(&psVar8->y);
          secp256k1_ge_verify(psVar8);
          return extraout_EAX;
        }
        if (cache != (secp256k1_musig_keyagg_cache *)0x0) {
          psVar8 = &sStack_360;
          psVar7 = &sStack_260;
          for (lVar6 = 0xd; lVar6 != 0; lVar6 = lVar6 + -1) {
            (psVar7->pk).x.n[0] = (psVar8->x).n[0];
            psVar8 = (secp256k1_ge *)((long)psVar8 + ((ulong)bVar16 * -2 + 1) * 8);
            psVar7 = (secp256k1_keyagg_cache_internal *)((long)psVar7 + (ulong)bVar16 * -0x10 + 8);
          }
          psVar8 = &sStack_2c8;
          psVar11 = &sStack_260.second_pk;
          for (lVar6 = 0xd; lVar6 != 0; lVar6 = lVar6 + -1) {
            (psVar11->x).n[0] = (psVar8->x).n[0];
            psVar8 = (secp256k1_ge *)((long)psVar8 + ((ulong)bVar16 * -2 + 1) * 8);
            psVar11 = (secp256k1_ge *)((long)psVar11 + ((ulong)bVar16 * -2 + 1) * 8);
          }
          sStack_260.tweak.d[2] = 0;
          sStack_260.tweak.d[3] = 0;
          sStack_260.tweak.d[0] = 0;
          sStack_260.tweak.d[1] = 0;
          sStack_260.parity_acc = 0;
          sStack_260._276_4_ = 0;
          sStack_260.pks_hash[0] = auStack_2f0[0];
          sStack_260.pks_hash[1] = auStack_2f0[1];
          sStack_260.pks_hash[2] = auStack_2f0[2];
          sStack_260.pks_hash[3] = auStack_2f0[3];
          sStack_260.pks_hash[4] = auStack_2f0[4];
          sStack_260.pks_hash[5] = auStack_2f0[5];
          sStack_260.pks_hash[6] = auStack_2f0[6];
          sStack_260.pks_hash[7] = auStack_2f0[7];
          sStack_260.pks_hash[8] = auStack_2e8[0];
          sStack_260.pks_hash[9] = auStack_2e8[1];
          sStack_260.pks_hash[10] = auStack_2e8[2];
          sStack_260.pks_hash[0xb] = auStack_2e8[3];
          sStack_260.pks_hash[0xc] = auStack_2e8[4];
          sStack_260.pks_hash[0xd] = auStack_2e8[5];
          sStack_260.pks_hash[0xe] = auStack_2e8[6];
          sStack_260.pks_hash[0xf] = auStack_2e8[7];
          sStack_260.pks_hash[0x10] = auStack_2e0[0];
          sStack_260.pks_hash[0x11] = auStack_2e0[1];
          sStack_260.pks_hash[0x12] = auStack_2e0[2];
          sStack_260.pks_hash[0x13] = auStack_2e0[3];
          sStack_260.pks_hash[0x14] = auStack_2e0[4];
          sStack_260.pks_hash[0x15] = auStack_2e0[5];
          sStack_260.pks_hash[0x16] = auStack_2e0[6];
          sStack_260.pks_hash[0x17] = auStack_2e0[7];
          sStack_260.pks_hash[0x18] = auStack_2d8[0];
          sStack_260.pks_hash[0x19] = auStack_2d8[1];
          sStack_260.pks_hash[0x1a] = auStack_2d8[2];
          sStack_260.pks_hash[0x1b] = auStack_2d8[3];
          sStack_260.pks_hash[0x1c] = auStack_2d8[4];
          sStack_260.pks_hash[0x1d] = auStack_2d8[5];
          sStack_260.pks_hash[0x1e] = auStack_2d8[6];
          sStack_260.pks_hash[0x1f] = auStack_2d8[7];
          secp256k1_keyagg_cache_save(cache,&sStack_260);
        }
        if (buf != (uchar *)0x0) {
          secp256k1_extrakeys_ge_even_y(&sStack_360);
          secp256k1_ge_to_bytes(buf,&sStack_360);
          return 1;
        }
        return 1;
      }
    }
    secp256k1_musig_pubkey_agg_cold_1();
  }
  secp256k1_musig_pubkey_agg_cold_5();
LAB_0012548a:
  secp256k1_musig_pubkey_agg_cold_4();
  return 0;
code_r0x00125288:
  lVar6 = lVar6 + 1;
  if (lVar6 == 0x40) goto code_r0x00125291;
  goto LAB_0012527e;
code_r0x00125291:
  sVar2 = sVar2 + 1;
  if (sVar2 == in_R8) goto LAB_001252c8;
  goto LAB_00125277;
}

Assistant:

SECP256K1_INLINE static int secp256k1_fe_equal(const secp256k1_fe *a, const secp256k1_fe *b) {
    secp256k1_fe na;
    SECP256K1_FE_VERIFY(a);
    SECP256K1_FE_VERIFY(b);
    SECP256K1_FE_VERIFY_MAGNITUDE(a, 1);
    SECP256K1_FE_VERIFY_MAGNITUDE(b, 31);

    secp256k1_fe_negate(&na, a, 1);
    secp256k1_fe_add(&na, b);
    return secp256k1_fe_normalizes_to_zero(&na);
}